

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_div_2d(mp_int *a,int b,mp_int *c,mp_int *d)

{
  mp_digit *pmVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  sbyte sVar6;
  long lVar7;
  ulong uVar8;
  mp_int t;
  mp_int t_1;
  
  if (b < 1) {
    iVar5 = mp_copy(a,c);
    if (d == (mp_int *)0x0) {
      return iVar5;
    }
    mp_zero(d);
    return iVar5;
  }
  iVar5 = mp_init(&t);
  if (iVar5 == 0) {
    if (((d == (mp_int *)0x0) || (iVar5 = mp_mod_2d(a,b,&t), iVar5 == 0)) &&
       (iVar5 = mp_copy(a,c), iVar5 == 0)) {
      if (0x3b < (uint)b) {
        mp_rshd(c,(uint)b / 0x3c);
      }
      if ((uint)b % 0x3c != 0) {
        sVar6 = (sbyte)((uint)b % 0x3c);
        pmVar1 = c->dp;
        uVar8 = 0;
        for (lVar7 = (long)(c->used + -1); -1 < (int)lVar7; lVar7 = lVar7 + -1) {
          uVar2 = pmVar1[lVar7];
          pmVar1[lVar7] = uVar8 << (0x3cU - sVar6 & 0x3f) | uVar2 >> sVar6;
          uVar8 = uVar2 & ~(-1L << sVar6);
        }
      }
      mp_clamp(c);
      if (d != (mp_int *)0x0) {
        pmVar1 = d->dp;
        uVar3._0_4_ = d->used;
        uVar3._4_4_ = d->alloc;
        uVar4._0_4_ = d->sign;
        uVar4._4_4_ = *(undefined4 *)&d->field_0xc;
        d->used = t.used;
        d->alloc = t.alloc;
        d->sign = t.sign;
        *(undefined4 *)&d->field_0xc = t._12_4_;
        d->dp = t.dp;
        t._0_8_ = uVar3;
        t._8_8_ = uVar4;
        t.dp = pmVar1;
      }
      mp_clear(&t);
      return 0;
    }
    mp_clear(&t);
    return iVar5;
  }
  return iVar5;
}

Assistant:

int mp_div_2d (mp_int * a, int b, mp_int * c, mp_int * d)
{
  mp_digit D, r, rr;
  int     x, res;
  mp_int  t;


  /* if the shift count is <= 0 then we do no work */
  if (b <= 0) {
    res = mp_copy (a, c);
    if (d != NULL) {
      mp_zero (d);
    }
    return res;
  }

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  /* get the remainder */
  if (d != NULL) {
    if ((res = mp_mod_2d (a, b, &t)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    mp_rshd (c, b / DIGIT_BIT);
  }

  /* shift any bit count < DIGIT_BIT */
  D = (mp_digit) (b % DIGIT_BIT);
  if (D != 0) {
    register mp_digit *tmpc, mask, shift;

    /* mask */
    mask = (((mp_digit)1) << D) - 1;

    /* shift for lsb */
    shift = DIGIT_BIT - D;

    /* alias */
    tmpc = c->dp + (c->used - 1);

    /* carry */
    r = 0;
    for (x = c->used - 1; x >= 0; x--) {
      /* get the lower  bits of this word in a temp */
      rr = *tmpc & mask;

      /* shift the current word and mix in the carry bits from the previous word */
      *tmpc = (*tmpc >> D) | (r << shift);
      --tmpc;

      /* set the carry to the carry bits of the current word found above */
      r = rr;
    }
  }
  mp_clamp (c);
  if (d != NULL) {
    mp_exch (&t, d);
  }
  mp_clear (&t);
  return MP_OKAY;
}